

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O1

bool __thiscall spvtools::opt::LoopFissionImpl::CanPerformSplit(LoopFissionImpl *this)

{
  _Rb_tree_header *p_Var1;
  IRContext *context;
  ulong uVar2;
  long lVar3;
  pointer pDVar4;
  bool bVar5;
  LoopFissionImpl *pLVar6;
  Loop *pLVar7;
  mapped_type_conflict *pmVar8;
  LoopFissionImpl *pLVar9;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range2;
  map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
  *this_00;
  int iVar10;
  iterator __position;
  LoopFissionImpl *this_01;
  LoopFissionImpl *pLVar11;
  _Base_ptr p_Var12;
  size_type __n;
  Instruction *store;
  Instruction *inst_1;
  DistanceVector vec;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> loops;
  Instruction *inst;
  LoopDependenceAnalysis analysis;
  allocator_type local_1f1;
  Instruction *local_1f0;
  Instruction *local_1e8;
  _Base_ptr local_1e0;
  DistanceVector local_1d8;
  Loop *local_1c0;
  _Base_ptr local_1b8;
  _Base_ptr p_Stack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_198;
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> local_178;
  LoopFissionImpl *local_160;
  value_type local_158;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> local_130;
  LoopDependenceAnalysis local_118;
  
  if (this->load_used_in_condition_ == false) {
    local_178.
    super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c0 = this->loop_;
    if (local_1c0 != (Loop *)0x0) {
      do {
        if (local_178.
            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_178.
            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Loop_const*,std::allocator<spvtools::opt::Loop_const*>>::
          _M_realloc_insert<spvtools::opt::Loop_const*const&>
                    ((vector<spvtools::opt::Loop_const*,std::allocator<spvtools::opt::Loop_const*>>
                      *)&local_178,
                     (iterator)
                     local_178.
                     super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_1c0);
        }
        else {
          *local_178.
           super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_1c0;
          local_178.
          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_178.
               super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_1c0 = local_1c0->parent_;
      } while (local_1c0 != (Loop *)0x0);
    }
    context = this->context_;
    std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
              (&local_130,&local_178);
    local_118.context_ = context;
    std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
              (&local_118.loops_,&local_130);
    ScalarEvolutionAnalysis::ScalarEvolutionAnalysis(&local_118.scalar_evolution_,context);
    local_118.constraints_.
    super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_118.constraints_;
    local_118.debug_stream_ = (ostream *)0x0;
    local_118.constraints_.
    super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
    ._M_impl._M_node._M_size = 0;
    this_01 = (LoopFissionImpl *)
              local_130.
              super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_118.constraints_.
    super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_118.constraints_.
         super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if ((LoopFissionImpl *)
        local_130.
        super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (LoopFissionImpl *)0x0) {
      operator_delete(local_130.
                      super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_130.
                            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.
                            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      this_01 = (LoopFissionImpl *)
                local_130.
                super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    local_198 = (_Base_ptr)0x0;
    p_Stack_190 = (_Base_ptr)0x0;
    local_188 = (_Base_ptr)0x0;
    local_1a8 = (_Base_ptr)0x0;
    local_1b8 = (_Base_ptr)0x0;
    p_Stack_1b0 = (_Base_ptr)0x0;
    pLVar6 = (LoopFissionImpl *)
             (this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    if (pLVar6 != (LoopFissionImpl *)p_Var1) {
      pLVar11 = this_01;
      do {
        this_01 = pLVar6;
        local_158._0_8_ =
             (this_01->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_right;
        if (((Instruction *)local_158._0_8_)->opcode_ == OpLoad) {
          __position._M_current = (Instruction **)p_Stack_1b0;
          pLVar6 = (LoopFissionImpl *)&local_1b8;
          if (p_Stack_1b0 == local_1a8) {
LAB_0024ad3d:
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            _M_realloc_insert<spvtools::opt::Instruction*const&>
                      ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                        *)pLVar6,__position,(Instruction **)&local_158);
            pLVar11 = pLVar6;
          }
          else {
            *(undefined8 *)p_Stack_1b0 = local_158._0_8_;
            p_Stack_1b0 = (_Base_ptr)&p_Stack_1b0->_M_parent;
          }
        }
        else if (((Instruction *)local_158._0_8_)->opcode_ == OpStore) {
          __position._M_current = (Instruction **)p_Stack_190;
          pLVar6 = (LoopFissionImpl *)&local_198;
          if (p_Stack_190 == local_188) goto LAB_0024ad3d;
          *(undefined8 *)p_Stack_190 = local_158._0_8_;
          p_Stack_190 = (_Base_ptr)&p_Stack_190->_M_parent;
        }
        bVar5 = MovableInstruction(pLVar11,(Instruction *)local_158._0_8_);
        if (!bVar5) {
          bVar5 = false;
          goto LAB_0024b064;
        }
        pLVar6 = (LoopFissionImpl *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
        pLVar11 = this_01;
      } while (pLVar6 != (LoopFissionImpl *)p_Var1);
    }
    pLVar7 = this->loop_;
    __n = 0;
    do {
      pLVar7 = pLVar7->parent_;
      __n = __n + 1;
    } while (pLVar7 != (Loop *)0x0);
    pLVar11 = (LoopFissionImpl *)
              (this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    pLVar6 = (LoopFissionImpl *)
             &(this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    if (pLVar11 == pLVar6) {
      bVar5 = true;
    }
    else {
      this_00 = &this->instruction_order_;
      local_160 = pLVar6;
      do {
        local_1e8 = (Instruction *)
                    (pLVar11->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_right;
        bVar5 = MovableInstruction(this_01,local_1e8);
        iVar10 = 1;
        if (bVar5) {
          if (local_1e8->opcode_ == OpStore) {
            local_1e0 = p_Stack_1b0;
            p_Var12 = local_1b8;
            if (local_1b8 != p_Stack_1b0) {
              do {
                local_1f0 = *(Instruction **)p_Var12;
                local_158._0_8_ = (Instruction *)0x700000000;
                local_158.distance = 0;
                local_158.peel_first = false;
                local_158.peel_last = false;
                local_158.point_x = 0;
                local_158.point_y = 0;
                std::
                vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                ::vector(&local_1d8.entries,__n,&local_158,&local_1f1);
                pmVar8 = std::
                         map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                         ::operator[](this_00,&local_1f0);
                uVar2 = *pmVar8;
                pmVar8 = std::
                         map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                         ::operator[](this_00,&local_1e8);
                iVar10 = 1;
                if (uVar2 <= *pmVar8) {
                  bVar5 = LoopDependenceAnalysis::GetDependence
                                    (&local_118,local_1e8,local_1f0,&local_1d8);
                  if (!bVar5) {
                    iVar10 = 0xe;
                    bVar5 = local_1d8.entries.
                            super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                            local_1d8.entries.
                            super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                    if (!bVar5) {
                      lVar3 = (local_1d8.entries.
                               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start)->distance;
                      pDVar4 = local_1d8.entries.
                               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      while (-1 < lVar3) {
                        bVar5 = pDVar4 + 1 ==
                                local_1d8.entries.
                                super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                        if (bVar5) goto LAB_0024aff5;
                        lVar3 = pDVar4[1].distance;
                        pDVar4 = pDVar4 + 1;
                      }
                      iVar10 = 1;
                    }
LAB_0024aff5:
                    if (!bVar5) goto LAB_0024affb;
                  }
                  iVar10 = 0;
                }
LAB_0024affb:
                if (local_1d8.entries.
                    super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1d8.entries.
                                  super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1d8.entries.
                                        super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1d8.entries.
                                        super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (iVar10 != 0) goto LAB_0024b02a;
                p_Var12 = (_Base_ptr)&p_Var12->_M_parent;
              } while (p_Var12 != local_1e0);
            }
            iVar10 = 0xc;
LAB_0024b02a:
            bVar5 = iVar10 == 0xc;
LAB_0024b02d:
            pLVar6 = local_160;
            if (!bVar5) goto LAB_0024b039;
          }
          else if (local_1e8->opcode_ == OpLoad) {
            local_1e0 = p_Stack_190;
            p_Var12 = local_198;
            if (local_198 != p_Stack_190) {
              do {
                local_1f0 = *(Instruction **)p_Var12;
                local_158._0_8_ = (Instruction *)0x700000000;
                local_158.distance = 0;
                local_158.peel_first = false;
                local_158.peel_last = false;
                local_158.point_x = 0;
                local_158.point_y = 0;
                std::
                vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                ::vector(&local_1d8.entries,__n,&local_158,&local_1f1);
                pmVar8 = std::
                         map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                         ::operator[](this_00,&local_1f0);
                uVar2 = *pmVar8;
                pmVar8 = std::
                         map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                         ::operator[](this_00,&local_1e8);
                iVar10 = 1;
                if (uVar2 <= *pmVar8) {
                  bVar5 = LoopDependenceAnalysis::GetDependence
                                    (&local_118,local_1f0,local_1e8,&local_1d8);
                  if (!bVar5) {
                    iVar10 = 10;
                    bVar5 = local_1d8.entries.
                            super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                            local_1d8.entries.
                            super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                    if (!bVar5) {
                      lVar3 = (local_1d8.entries.
                               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start)->distance;
                      pDVar4 = local_1d8.entries.
                               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      while (lVar3 < 1) {
                        bVar5 = pDVar4 + 1 ==
                                local_1d8.entries.
                                super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                        if (bVar5) goto LAB_0024aec7;
                        lVar3 = pDVar4[1].distance;
                        pDVar4 = pDVar4 + 1;
                      }
                      iVar10 = 1;
                    }
LAB_0024aec7:
                    if (!bVar5) goto LAB_0024aecd;
                  }
                  iVar10 = 0;
                }
LAB_0024aecd:
                if (local_1d8.entries.
                    super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1d8.entries.
                                  super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1d8.entries.
                                        super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1d8.entries.
                                        super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (iVar10 != 0) goto LAB_0024aefc;
                p_Var12 = (_Base_ptr)&p_Var12->_M_parent;
              } while (p_Var12 != local_1e0);
            }
            iVar10 = 8;
LAB_0024aefc:
            bVar5 = iVar10 == 8;
            goto LAB_0024b02d;
          }
          iVar10 = 0;
        }
LAB_0024b039:
        if (iVar10 != 0) goto LAB_0024b056;
        pLVar9 = (LoopFissionImpl *)std::_Rb_tree_increment((_Rb_tree_node_base *)pLVar11);
        this_01 = pLVar11;
        pLVar11 = pLVar9;
      } while (pLVar9 != pLVar6);
      iVar10 = 6;
LAB_0024b056:
      bVar5 = iVar10 == 6;
    }
LAB_0024b064:
    if (local_1b8 != (_Base_ptr)0x0) {
      operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
    }
    if (local_198 != (_Base_ptr)0x0) {
      operator_delete(local_198,(long)local_188 - (long)local_198);
    }
    std::__cxx11::
    _List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
    ::_M_clear(&local_118.constraints_.
                super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
              );
    std::
    _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
    ::_M_erase(&local_118.scalar_evolution_.pretend_equal_._M_t,
               (_Link_type)
               local_118.scalar_evolution_.pretend_equal_._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_parent);
    std::
    _Hashtable<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>,_std::__detail::_Identity,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_spvtools::opt::SENodeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_118.scalar_evolution_.node_cache_._M_h);
    std::
    _Rb_tree<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>,_std::_Select1st<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
    ::_M_erase(&local_118.scalar_evolution_.recurrent_node_map_._M_t,
               (_Link_type)
               local_118.scalar_evolution_.recurrent_node_map_._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_parent);
    if ((_Base_ptr)
        local_118.loops_.
        super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
      operator_delete(local_118.loops_.
                      super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.loops_.
                            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.loops_.
                            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Base_ptr)
        local_178.
        super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
      operator_delete(local_178.
                      super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.
                            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.
                            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool LoopFissionImpl::CanPerformSplit() {
  // Return false if any of the condition instructions in the loop depend on a
  // load.
  if (load_used_in_condition_) {
    return false;
  }

  // Build a list of all parent loops of this loop. Loop dependence analysis
  // needs this structure.
  std::vector<const Loop*> loops;
  Loop* parent_loop = loop_;
  while (parent_loop) {
    loops.push_back(parent_loop);
    parent_loop = parent_loop->GetParent();
  }

  LoopDependenceAnalysis analysis{context_, loops};

  // A list of all the stores in the cloned loop.
  std::vector<Instruction*> set_one_stores{};

  // A list of all the loads in the cloned loop.
  std::vector<Instruction*> set_one_loads{};

  // Populate the above lists.
  for (Instruction* inst : cloned_loop_instructions_) {
    if (inst->opcode() == spv::Op::OpStore) {
      set_one_stores.push_back(inst);
    } else if (inst->opcode() == spv::Op::OpLoad) {
      set_one_loads.push_back(inst);
    }

    // If we find any instruction which we can't move (such as a barrier),
    // return false.
    if (!MovableInstruction(*inst)) return false;
  }

  // We need to calculate the depth of the loop to create the loop dependency
  // distance vectors.
  const size_t loop_depth = loop_->GetDepth();

  // Check the dependencies between loads in the cloned loop and stores in the
  // original and vice versa.
  for (Instruction* inst : original_loop_instructions_) {
    // If we find any instruction which we can't move (such as a barrier),
    // return false.
    if (!MovableInstruction(*inst)) return false;

    // Look at the dependency between the loads in the original and stores in
    // the cloned loops.
    if (inst->opcode() == spv::Op::OpLoad) {
      for (Instruction* store : set_one_stores) {
        DistanceVector vec{loop_depth};

        // If the store actually should appear after the load, return false.
        // This means the store has been placed in the wrong grouping.
        if (instruction_order_[store] > instruction_order_[inst]) {
          return false;
        }
        // If not independent check the distance vector.
        if (!analysis.GetDependence(store, inst, &vec)) {
          for (DistanceEntry& entry : vec.GetEntries()) {
            // A distance greater than zero means that the store in the cloned
            // loop has a dependency on the load in the original loop.
            if (entry.distance > 0) return false;
          }
        }
      }
    } else if (inst->opcode() == spv::Op::OpStore) {
      for (Instruction* load : set_one_loads) {
        DistanceVector vec{loop_depth};

        // If the load actually should appear after the store, return false.
        if (instruction_order_[load] > instruction_order_[inst]) {
          return false;
        }

        // If not independent check the distance vector.
        if (!analysis.GetDependence(inst, load, &vec)) {
          for (DistanceEntry& entry : vec.GetEntries()) {
            // A distance less than zero means the load in the cloned loop is
            // dependent on the store instruction in the original loop.
            if (entry.distance < 0) return false;
          }
        }
      }
    }
  }
  return true;
}